

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O2

void __thiscall flow::lang::ParamList::dump(ParamList *this,char *title)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  
  if ((title != (char *)0x0) && (*title != '\0')) {
    puts(title);
  }
  puVar1 = (this->values_).
           super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->values_).
           super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar3 = 0; ((long)puVar1 - (long)puVar2 & 0x7fffffff8U) != uVar3; uVar3 = uVar3 + 8) {
    printf("%16s: ",*(undefined8 *)
                     ((long)&(((this->names_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     uVar3 * 4));
    ASTPrinter::print(*(ASTNode **)
                       ((long)&(((this->values_).
                                 super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                               super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                               ._M_t + uVar3));
  }
  return;
}

Assistant:

void ParamList::dump(const char* title) {
  if (title && *title) {
    printf("%s\n", title);
  }
  for (int i = 0, e = size(); i != e; ++i) {
    printf("%16s: ", names_[i].c_str());
    ASTPrinter::print(values_[i].get());
  }
}